

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

iterator __thiscall
fmt::v5::internal::
arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>::
operator()(arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
           *this,void *value)

{
  undefined8 extraout_RDX;
  iterator iVar1;
  error_handler local_11;
  
  if (this->specs_ != (format_specs *)0x0) {
    check_pointer_type_spec<char,fmt::v5::internal::error_handler>
              ((this->specs_->super_core_format_specs).type,&local_11);
  }
  write_pointer(this,value);
  iVar1._9_7_ = (undefined7)((ulong)extraout_RDX >> 8);
  iVar1.blackhole_ = (this->writer_).out_.blackhole_;
  iVar1.count_ = (this->writer_).out_.count_;
  return iVar1;
}

Assistant:

iterator operator()(const void *value) {
    if (specs_)
      check_pointer_type_spec(specs_->type, internal::error_handler());
    write_pointer(value);
    return out();
  }